

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

appender fmt::v9::detail::write_int_noinline<char,fmt::v9::appender,unsigned_int>
                   (appender out,write_int_arg<unsigned_int> arg,basic_format_specs<char> *specs,
                   locale_ref loc)

{
  presentation_type pVar1;
  bool bVar2;
  byte bVar3;
  uint uVar4;
  char *digits;
  appender aVar5;
  byte *pbVar6;
  char *pcVar7;
  size_t sVar8;
  long lVar9;
  write_int_arg<unsigned_int> wVar10;
  char *pcVar11;
  buffer<char> *buf;
  ulong uVar12;
  int size;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  format_decimal_result<char_*> fVar18;
  char buffer [10];
  write_int_data<char> data;
  byte local_79;
  undefined1 local_78 [32];
  bool local_58;
  write_int_data<char> local_48;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> local_38;
  
  pVar1 = specs->type;
  local_38 = out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container;
  if (pVar1 < string) {
    uVar17 = (ulong)arg >> 0x20;
    uVar16 = arg.prefix;
    uVar13 = arg.abs_value;
    switch(pVar1) {
    case none:
    case dec:
      uVar12 = (ulong)arg & 0xffffffff;
      if (((specs->field_0xa & 1) != 0) &&
         (bVar2 = write_int_localized<fmt::v9::appender,unsigned_long,char>
                            ((appender *)&local_38,uVar12,uVar16,specs,loc), bVar2)) {
        return (appender)(back_insert_iterator<fmt::v9::detail::buffer<char>_>)local_38.container;
      }
      out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container =
           (back_insert_iterator<fmt::v9::detail::buffer<char>_>)
           (back_insert_iterator<fmt::v9::detail::buffer<char>_>)local_38.container;
      uVar14 = 0x1f;
      if ((uVar13 | 1) != 0) {
        for (; (uVar13 | 1) >> uVar14 == 0; uVar14 = uVar14 - 1) {
        }
      }
      uVar15 = *(long *)(do_count_digits(unsigned_int)::table + (ulong)uVar14 * 8) + uVar12;
      size = (int)(uVar15 >> 0x20);
      if (specs->precision != -1 || specs->width != 0) {
        write_int_data<char>::write_int_data(&local_48,size,uVar16,specs);
        local_78._8_8_ = local_48.size;
        local_78._16_8_ = local_48.padding;
        local_78._24_8_ = uVar15 & 0xffffffff00000000 | uVar12;
        local_78._0_4_ = uVar16;
        aVar5 = write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::write_int<fmt::v9::appender,char,fmt::v9::detail::write_int<char,fmt::v9::appender,unsigned_int>(fmt::v9::appender,fmt::v9::detail::write_int_arg<unsigned_int>,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_1_>(fmt::v9::appender,int,unsigned_int,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::write_int<char,fmt::v9::appender,unsigned_int>(fmt::v9::appender,fmt::v9::detail::write_int_arg<unsigned_int>,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_1_)::_lambda(fmt::v9::appender)_1_&>
                          (out,specs,local_48.size,local_48.size,
                           (anon_class_32_3_03e05ccd *)local_78);
        return (appender)
               aVar5.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container.container;
      }
      if ((long)uVar15 < 0) {
        assert_fail("/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/code/include/spdlog/fmt/bundled/core.h"
                    ,0x199,"negative value");
      }
      if ((uVar17 != 0) && (uVar16 = uVar16 & 0xffffff, ((ulong)arg & 0xffffff00000000) != 0)) {
        do {
          sVar8 = ((buffer<char> *)
                  out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container)->size_;
          uVar17 = sVar8 + 1;
          if (((buffer<char> *)
              out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container)->capacity_ <
              uVar17) {
            (**((buffer<char> *)
               out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container)->
               _vptr_buffer)(out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                             container);
            sVar8 = ((buffer<char> *)
                    out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container)->size_
            ;
            uVar17 = sVar8 + 1;
          }
          ((buffer<char> *)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container)
          ->size_ = uVar17;
          ((buffer<char> *)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container)
          ->ptr_[sVar8] = (char)uVar16;
          bVar2 = 0xff < uVar16;
          uVar16 = uVar16 >> 8;
        } while (bVar2);
      }
      fVar18 = format_decimal<char,unsigned_int>(local_78,uVar13,size);
      pcVar7 = fVar18.end;
      break;
    case oct:
      uVar14 = 0x1f;
      if ((uVar13 | 1) != 0) {
        for (; (uVar13 | 1) >> uVar14 == 0; uVar14 = uVar14 - 1) {
        }
      }
      uVar14 = uVar14 & 0xff;
      bVar3 = (char)(uVar14 * 0x56 >> 8) + 1;
      uVar12 = (ulong)bVar3;
      if (((specs->field_0x9 & 0x80) != 0) && (uVar13 != 0 && specs->precision <= (int)(uint)bVar3))
      {
        uVar13 = 0x3000;
        if (uVar17 == 0) {
          uVar13 = 0x30;
        }
        uVar17 = (ulong)((uVar13 | uVar16) + 0x1000000);
      }
      uVar13 = (uint)uVar17;
      if (specs->precision != -1 || specs->width != 0) {
        write_int_data<char>::write_int_data(&local_48,(uint)bVar3,uVar13,specs);
        local_78._8_8_ = local_48.size;
        local_78._16_8_ = local_48.padding;
        local_78._24_8_ = (ulong)arg & 0xffffffff | uVar12 << 0x20;
        local_78._0_4_ = uVar13;
        aVar5 = write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::write_int<fmt::v9::appender,char,fmt::v9::detail::write_int<char,fmt::v9::appender,unsigned_int>(fmt::v9::appender,fmt::v9::detail::write_int_arg<unsigned_int>,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_4_>(fmt::v9::appender,int,unsigned_int,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::write_int<char,fmt::v9::appender,unsigned_int>(fmt::v9::appender,fmt::v9::detail::write_int_arg<unsigned_int>,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_4_)::_lambda(fmt::v9::appender)_1_&>
                          (out,specs,local_48.size,local_48.size,
                           (anon_class_32_3_03e05ccd *)local_78);
        return (appender)
               aVar5.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container.container;
      }
      if ((uVar13 != 0) && (uVar13 = uVar13 & 0xffffff, (uVar17 & 0xffffff) != 0)) {
        do {
          lVar9 = *(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                                  container + 0x10);
          uVar17 = lVar9 + 1;
          if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                               container + 0x18) < uVar17) {
            (*(code *)**(undefined8 **)
                        out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container)
                      (out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container);
            lVar9 = *(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                                    container + 0x10);
            uVar17 = lVar9 + 1;
          }
          *(ulong *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container
                    + 0x10) = uVar17;
          *(char *)(*(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                                    container + 8) + lVar9) = (char)uVar13;
          bVar2 = 0xff < uVar13;
          uVar13 = uVar13 >> 8;
        } while (bVar2);
      }
      lVar9 = *(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                              container + 0x10);
      uVar17 = lVar9 + uVar12;
      if (uVar17 <= *(ulong *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                                     container + 0x18)) {
        *(ulong *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container +
                  0x10) = uVar17;
        if (*(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container
                     + 8) != 0) {
          pbVar6 = (byte *)(*(long *)((long)out.
                                            super_back_insert_iterator<fmt::v9::detail::buffer<char>_>
                                            .container + 8) + lVar9 + (ulong)uVar14 / 3);
          wVar10 = (write_int_arg<unsigned_int>)((ulong)arg & 0xffffffff);
          do {
            uVar13 = arg.abs_value;
            *pbVar6 = (byte)arg.abs_value & 7 | 0x30;
            wVar10 = (write_int_arg<unsigned_int>)((ulong)wVar10 >> 3);
            pbVar6 = pbVar6 + -1;
            arg = wVar10;
          } while (7 < uVar13);
          return (appender)
                 out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container.container;
        }
      }
      pcVar7 = local_78 + uVar12;
      pbVar6 = local_78 + (ulong)uVar14 / 3;
      wVar10 = (write_int_arg<unsigned_int>)((ulong)arg & 0xffffffff);
      do {
        uVar13 = arg.abs_value;
        *pbVar6 = (byte)arg.abs_value & 7 | 0x30;
        wVar10 = (write_int_arg<unsigned_int>)((ulong)wVar10 >> 3);
        pbVar6 = pbVar6 + -1;
        arg = wVar10;
      } while (7 < uVar13);
      break;
    case hex_lower:
    case hex_upper:
      local_79 = pVar1 == hex_upper;
      if ((specs->field_0x9 & 0x80) != 0) {
        uVar4 = (uint)(pVar1 != hex_upper) << 0xd | 0x5830;
        uVar14 = uVar4 << 8;
        if (uVar17 == 0) {
          uVar14 = uVar4;
        }
        uVar17 = (ulong)((uVar14 | uVar16) + 0x2000000);
      }
      uVar16 = 0x1f;
      if ((uVar13 | 1) != 0) {
        for (; (uVar13 | 1) >> uVar16 == 0; uVar16 = uVar16 - 1) {
        }
      }
      uVar13 = 8 - ((uVar16 ^ 0x1c) >> 2);
      uVar12 = (ulong)uVar13;
      uVar16 = (uint)uVar17;
      if (specs->precision != -1 || specs->width != 0) {
        write_int_data<char>::write_int_data(&local_48,uVar13,uVar16,specs);
        local_78._8_8_ = local_48.size;
        local_78._16_8_ = local_48.padding;
        local_78._24_8_ = (ulong)arg & 0xffffffff | uVar12 << 0x20;
        local_58 = (bool)local_79;
        local_78._0_4_ = uVar16;
        aVar5 = write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::write_int<fmt::v9::appender,char,fmt::v9::detail::write_int<char,fmt::v9::appender,unsigned_int>(fmt::v9::appender,fmt::v9::detail::write_int_arg<unsigned_int>,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_2_>(fmt::v9::appender,int,unsigned_int,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::write_int<char,fmt::v9::appender,unsigned_int>(fmt::v9::appender,fmt::v9::detail::write_int_arg<unsigned_int>,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_2_)::_lambda(fmt::v9::appender)_1_&>
                          (out,specs,local_48.size,local_48.size,
                           (anon_class_40_3_03e05ccd *)local_78);
        return (appender)
               aVar5.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container.container;
      }
      if ((uVar16 != 0) && (uVar13 = uVar16 & 0xffffff, (uVar17 & 0xffffff) != 0)) {
        do {
          lVar9 = *(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                                  container + 0x10);
          uVar17 = lVar9 + 1;
          if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                               container + 0x18) < uVar17) {
            (*(code *)**(undefined8 **)
                        out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container)
                      (out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container);
            lVar9 = *(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                                    container + 0x10);
            uVar17 = lVar9 + 1;
          }
          *(ulong *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container
                    + 0x10) = uVar17;
          *(char *)(*(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                                    container + 8) + lVar9) = (char)uVar13;
          bVar2 = 0xff < uVar13;
          uVar13 = uVar13 >> 8;
        } while (bVar2);
      }
      uVar17 = *(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                               container + 0x10) + uVar12;
      if (uVar17 <= *(ulong *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                                     container + 0x18)) {
        *(ulong *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container +
                  0x10) = uVar17;
        if (*(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container
                     + 8) != 0) {
          pcVar7 = "0123456789abcdef";
          if (pVar1 == hex_upper) {
            pcVar7 = "0123456789ABCDEF";
          }
          pcVar11 = (char *)(uVar17 + *(long *)((long)out.
                                                  super_back_insert_iterator<fmt::v9::detail::buffer<char>_>
                                                  .container + 8));
          wVar10 = (write_int_arg<unsigned_int>)((ulong)arg & 0xffffffff);
          do {
            pcVar11 = pcVar11 + -1;
            uVar13 = arg.abs_value;
            *pcVar11 = pcVar7[uVar13 & 0xf];
            wVar10 = (write_int_arg<unsigned_int>)((ulong)wVar10 >> 4);
            arg = wVar10;
          } while (0xf < uVar13);
          return (appender)
                 out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container.container;
        }
      }
      pcVar7 = local_78 + uVar12;
      pcVar11 = "0123456789abcdef";
      if (pVar1 == hex_upper) {
        pcVar11 = "0123456789ABCDEF";
      }
      pbVar6 = &local_79 + uVar12;
      wVar10 = (write_int_arg<unsigned_int>)((ulong)arg & 0xffffffff);
      do {
        uVar13 = arg.abs_value;
        *pbVar6 = pcVar11[uVar13 & 0xf];
        wVar10 = (write_int_arg<unsigned_int>)((ulong)wVar10 >> 4);
        pbVar6 = pbVar6 + -1;
        arg = wVar10;
      } while (0xf < uVar13);
      break;
    case bin_lower:
    case bin_upper:
      if ((specs->field_0x9 & 0x80) != 0) {
        uVar4 = (uint)(pVar1 != bin_upper) << 0xd | 0x4230;
        uVar14 = uVar4 << 8;
        if (uVar17 == 0) {
          uVar14 = uVar4;
        }
        uVar17 = (ulong)((uVar14 | uVar16) + 0x2000000);
      }
      uVar16 = 0x1f;
      if ((uVar13 | 1) != 0) {
        for (; (uVar13 | 1) >> uVar16 == 0; uVar16 = uVar16 - 1) {
        }
      }
      uVar13 = (uVar16 ^ 0xffffffe0) + 0x21;
      uVar12 = (ulong)uVar13;
      uVar16 = (uint)uVar17;
      if (specs->precision != -1 || specs->width != 0) {
        write_int_data<char>::write_int_data(&local_48,uVar13,uVar16,specs);
        local_78._8_8_ = local_48.size;
        local_78._16_8_ = local_48.padding;
        local_78._24_8_ = (ulong)arg & 0xffffffff | uVar12 << 0x20;
        local_78._0_4_ = uVar16;
        aVar5 = write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::write_int<fmt::v9::appender,char,fmt::v9::detail::write_int<char,fmt::v9::appender,unsigned_int>(fmt::v9::appender,fmt::v9::detail::write_int_arg<unsigned_int>,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_3_>(fmt::v9::appender,int,unsigned_int,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::write_int<char,fmt::v9::appender,unsigned_int>(fmt::v9::appender,fmt::v9::detail::write_int_arg<unsigned_int>,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_3_)::_lambda(fmt::v9::appender)_1_&>
                          (out,specs,local_48.size,local_48.size,
                           (anon_class_32_3_03e05ccd *)local_78);
        return (appender)
               aVar5.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container.container;
      }
      if ((uVar16 != 0) && (uVar13 = uVar16 & 0xffffff, (uVar17 & 0xffffff) != 0)) {
        do {
          lVar9 = *(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                                  container + 0x10);
          uVar17 = lVar9 + 1;
          if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                               container + 0x18) < uVar17) {
            (*(code *)**(undefined8 **)
                        out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container)
                      (out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container);
            lVar9 = *(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                                    container + 0x10);
            uVar17 = lVar9 + 1;
          }
          *(ulong *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container
                    + 0x10) = uVar17;
          *(char *)(*(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                                    container + 8) + lVar9) = (char)uVar13;
          bVar2 = 0xff < uVar13;
          uVar13 = uVar13 >> 8;
        } while (bVar2);
      }
      uVar17 = *(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                               container + 0x10) + uVar12;
      if (uVar17 <= *(ulong *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                                     container + 0x18)) {
        *(ulong *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container +
                  0x10) = uVar17;
        if (*(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container
                     + 8) != 0) {
          pbVar6 = (byte *)(uVar17 + *(long *)((long)out.
                                                  super_back_insert_iterator<fmt::v9::detail::buffer<char>_>
                                                  .container + 8));
          wVar10 = (write_int_arg<unsigned_int>)((ulong)arg & 0xffffffff);
          do {
            pbVar6 = pbVar6 + -1;
            uVar13 = arg.abs_value;
            *pbVar6 = (byte)arg.abs_value & 1 | 0x30;
            wVar10 = (write_int_arg<unsigned_int>)((ulong)wVar10 >> 1);
            arg = wVar10;
          } while (1 < uVar13);
          return (appender)
                 out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container.container;
        }
      }
      pcVar7 = local_78 + uVar12;
      pbVar6 = &local_79 + uVar12;
      wVar10 = (write_int_arg<unsigned_int>)((ulong)arg & 0xffffffff);
      do {
        uVar13 = arg.abs_value;
        *pbVar6 = (byte)arg.abs_value & 1 | 0x30;
        wVar10 = (write_int_arg<unsigned_int>)((ulong)wVar10 >> 1);
        pbVar6 = pbVar6 + -1;
        arg = wVar10;
      } while (1 < uVar13);
      break;
    default:
      goto switchD_001236a4_caseD_7;
    case chr:
      local_78._0_4_ = (uint)CONCAT21(local_78._2_2_,(char)arg.abs_value) << 8;
      aVar5 = write_padded<(fmt::v9::align::type)1,fmt::v9::appender,char,fmt::v9::detail::write_char<char,fmt::v9::appender>(fmt::v9::appender,char,fmt::v9::basic_format_specs<char>const&)::_lambda(fmt::v9::appender)_1_&>
                        (out,specs,1,1,(anon_class_2_2_bf5026b7 *)local_78);
      return (appender)
             aVar5.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container.container;
    }
    aVar5 = copy_str_noinline<char,char*,fmt::v9::appender>(local_78,pcVar7,out);
    return (appender)
           aVar5.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container.container;
  }
switchD_001236a4_caseD_7:
  throw_format_error("invalid type specifier");
}

Assistant:

FMT_CONSTEXPR FMT_NOINLINE auto write_int_noinline(
    OutputIt out, write_int_arg<T> arg, const basic_format_specs<Char>& specs,
    locale_ref loc) -> OutputIt {
  return write_int(out, arg, specs, loc);
}